

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CropResizeLayerParams::MergeFrom
          (CropResizeLayerParams *this,CropResizeLayerParams *from)

{
  float fVar1;
  int iVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  SamplingMode *this_00;
  BoxCoordinatesMode *this_01;
  SamplingMode *from_00;
  BoxCoordinatesMode *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x930b);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar2 = (from->targetsize_).current_size_;
  if (iVar2 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->targetsize_,iVar2 + (this->targetsize_).current_size_);
    memcpy(((this->targetsize_).rep_)->elements + (this->targetsize_).current_size_,
           ((from->targetsize_).rep_)->elements,(long)(from->targetsize_).current_size_ << 3);
    (this->targetsize_).current_size_ =
         (this->targetsize_).current_size_ + (from->targetsize_).current_size_;
  }
  from_00 = from->mode_;
  if (from_00 != (SamplingMode *)0x0 &&
      from != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    this_00 = this->mode_;
    if (this_00 == (SamplingMode *)0x0) {
      this_00 = (SamplingMode *)operator_new(0x18);
      SamplingMode::SamplingMode(this_00);
      this->mode_ = this_00;
      from_00 = from->mode_;
    }
    if (from_00 == (SamplingMode *)0x0) {
      from_00 = (SamplingMode *)&_SamplingMode_default_instance_;
    }
    SamplingMode::MergeFrom(this_00,from_00);
  }
  from_01 = from->boxindicesmode_;
  if (from_01 != (BoxCoordinatesMode *)0x0 &&
      from != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    this_01 = this->boxindicesmode_;
    if (this_01 == (BoxCoordinatesMode *)0x0) {
      this_01 = (BoxCoordinatesMode *)operator_new(0x18);
      BoxCoordinatesMode::BoxCoordinatesMode(this_01);
      this->boxindicesmode_ = this_01;
      from_01 = from->boxindicesmode_;
    }
    if (from_01 == (BoxCoordinatesMode *)0x0) {
      from_01 = (BoxCoordinatesMode *)&_BoxCoordinatesMode_default_instance_;
    }
    BoxCoordinatesMode::MergeFrom(this_01,from_01);
  }
  if (from->normalizedcoordinates_ == true) {
    this->normalizedcoordinates_ = true;
  }
  fVar1 = from->spatialscale_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->spatialscale_ = fVar1;
  }
  return;
}

Assistant:

void CropResizeLayerParams::MergeFrom(const CropResizeLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CropResizeLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  targetsize_.MergeFrom(from.targetsize_);
  if (from.has_mode()) {
    mutable_mode()->::CoreML::Specification::SamplingMode::MergeFrom(from.mode());
  }
  if (from.has_boxindicesmode()) {
    mutable_boxindicesmode()->::CoreML::Specification::BoxCoordinatesMode::MergeFrom(from.boxindicesmode());
  }
  if (from.normalizedcoordinates() != 0) {
    set_normalizedcoordinates(from.normalizedcoordinates());
  }
  if (from.spatialscale() != 0) {
    set_spatialscale(from.spatialscale());
  }
}